

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O0

void __thiscall
Assimp::FileSystemFilter::FileSystemFilter(FileSystemFilter *this,string *file,IOSystem *old)

{
  int iVar1;
  ulong uVar2;
  reference pcVar3;
  Logger *this_00;
  bool local_ca;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char local_39;
  ulong uStack_38;
  char s;
  size_type ss2;
  IOSystem *local_20;
  IOSystem *old_local;
  string *file_local;
  FileSystemFilter *this_local;
  
  local_20 = old;
  old_local = (IOSystem *)file;
  file_local = (string *)this;
  IOSystem::IOSystem(&this->super_IOSystem);
  (this->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__FileSystemFilter_0037a388;
  this->mWrapped = local_20;
  std::__cxx11::string::string((string *)&this->mSrc_file,(string *)old_local);
  std::__cxx11::string::string((string *)&this->mBase);
  iVar1 = (*this->mWrapped->_vptr_IOSystem[3])();
  this->mSep = (char)iVar1;
  if (this->mWrapped != (IOSystem *)0x0) {
    std::__cxx11::string::operator=((string *)&this->mBase,(string *)&this->mSrc_file);
    uVar2 = std::__cxx11::string::find_last_of((char *)&this->mBase,0x2bded0);
    uStack_38 = uVar2;
    if (uVar2 == 0xffffffffffffffff) {
      std::__cxx11::string::operator=((string *)&this->mBase,"");
    }
    else {
      std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)&this->mBase,uVar2);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_50._M_current = (char *)std::__cxx11::string::end();
      local_48 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&local_50,1);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      local_39 = *pcVar3;
      local_ca = local_39 != '\\' && local_39 != '/';
      if (local_ca) {
        iVar1 = (*(this->super_IOSystem)._vptr_IOSystem[3])();
        std::__cxx11::string::operator+=((string *)&this->mBase,(char)iVar1);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->mBase,".");
      iVar1 = (*(this->super_IOSystem)._vptr_IOSystem[3])();
      std::__cxx11::string::operator+=((string *)&this->mBase,(char)iVar1);
    }
    this_00 = DefaultLogger::get();
    std::operator+(&local_90,"Import root directory is \'",&this->mBase);
    std::operator+(&local_70,&local_90,"\'");
    Logger::info(this_00,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  __assert_fail("nullptr != mWrapped",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/FileSystemFilter.h"
                ,0x47,"Assimp::FileSystemFilter::FileSystemFilter(const std::string &, IOSystem *)")
  ;
}

Assistant:

FileSystemFilter(const std::string& file, IOSystem* old)
    : mWrapped  (old)
    , mSrc_file(file)
    , mSep(mWrapped->getOsSeparator()) {
        ai_assert(nullptr != mWrapped);

        // Determine base directory
        mBase = mSrc_file;
        std::string::size_type ss2;
        if (std::string::npos != (ss2 = mBase.find_last_of("\\/")))  {
            mBase.erase(ss2,mBase.length()-ss2);
        } else {
            mBase = "";
        }

        // make sure the directory is terminated properly
        char s;

        if ( mBase.empty() ) {
            mBase = ".";
            mBase += getOsSeparator();
        } else if ((s = *(mBase.end()-1)) != '\\' && s != '/') {
            mBase += getOsSeparator();
        }

        DefaultLogger::get()->info("Import root directory is \'" + mBase + "\'");
    }